

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpparser.c
# Opt level: O3

parse_status_t parser_parse_headers(http_parser_t *parser)

{
  membuffer *m;
  scanner_t *scanner;
  membuffer *m_00;
  char cVar1;
  parse_status_t pVar2;
  int iVar3;
  int iVar4;
  ListNode *pLVar5;
  undefined8 *item;
  http_header_t *phVar6;
  size_t sVar7;
  token_type_t tok_type;
  memptr token;
  memptr hdr_value;
  token_type_t local_b4;
  memptr local_b0;
  char *local_a0;
  size_t local_98;
  LinkedList *local_90;
  undefined1 local_88 [16];
  int local_78;
  
  if ((parser->position != POS_HEADERS) && (parser->ent_position != 6)) {
    __assert_fail("parser->position == (parser_pos_t)POS_HEADERS || parser->ent_position == ENTREAD_CHUNKY_HEADERS"
                  ,".upnp/src/genlib/net/http/httpparser.c",0x5c8,
                  "parse_status_t parser_parse_headers(http_parser_t *)");
  }
  scanner = &parser->scanner;
  sVar7 = (parser->scanner).cursor;
  pVar2 = scanner_get_token(scanner,&local_b0,&local_b4);
  if (pVar2 == PARSE_OK) {
    local_90 = &(parser->msg).headers;
    do {
      if (local_b4 != TT_IDENTIFIER) {
        if (local_b4 != TT_CRLF) {
          return PARSE_FAILURE;
        }
        if (((parser->msg).is_request != 0) && ((parser->msg).method == HTTPMETHOD_POST)) {
          parser->position = POS_COMPLETE;
          return PARSE_SUCCESS;
        }
        parser->position = POS_ENTITY;
        return PARSE_OK;
      }
      pVar2 = match(scanner," : %R%c",&local_a0);
      if (pVar2 != PARSE_OK) break;
      iVar3 = map_str_to_int(local_b0.buf,local_b0.length,Http_Header_Names,0x21,0);
      if (iVar3 == -1) {
        cVar1 = local_b0.buf[local_b0.length];
        local_b0.buf[local_b0.length] = '\0';
        phVar6 = httpmsg_find_hdr_str(&parser->msg,local_b0.buf);
        local_b0.buf[local_b0.length] = cVar1;
        iVar3 = -1;
      }
      else {
        iVar3 = Http_Header_Names[iVar3].id;
        if (iVar3 == 0x13) {
          (parser->msg).method = SOAPMETHOD_POST;
        }
        local_78 = iVar3;
        pLVar5 = ListFind(local_90,(ListNode *)0x0,local_88);
        phVar6 = (http_header_t *)0x0;
        if (pLVar5 != (ListNode *)0x0) {
          phVar6 = (http_header_t *)pLVar5->item;
        }
      }
      if (phVar6 == (http_header_t *)0x0) {
        item = (undefined8 *)malloc(0x58);
        if (item == (undefined8 *)0x0) goto LAB_00115f7a;
        m = (membuffer *)(item + 7);
        membuffer_init(m);
        m_00 = (membuffer *)(item + 3);
        membuffer_init(m_00);
        if (local_98 == 0) {
          local_a0 = &parser_parse_headers::zero;
          local_98 = 1;
        }
        iVar4 = membuffer_assign(m,local_b0.buf,local_b0.length);
        if ((iVar4 == 0) && (iVar4 = membuffer_assign(m_00,local_a0,local_98), iVar4 == 0)) {
          *item = item[7];
          item[1] = item[8];
          *(int *)(item + 2) = iVar3;
          pLVar5 = ListAddTail(local_90,item);
          if (pLVar5 != (ListNode *)0x0) goto LAB_00115f0e;
        }
        membuffer_destroy(m_00);
        membuffer_destroy(m);
        free(item);
LAB_00115f7a:
        parser->http_error_code = 500;
        return PARSE_FAILURE;
      }
      if (local_98 != 0) {
        iVar3 = membuffer_append_str(&phVar6->value,", ");
        iVar4 = membuffer_append(&phVar6->value,local_a0,local_98);
        if ((iVar3 == -0x68) || (iVar4 == -0x68)) goto LAB_00115f7a;
      }
LAB_00115f0e:
      sVar7 = (parser->scanner).cursor;
      pVar2 = scanner_get_token(scanner,&local_b0,&local_b4);
    } while (pVar2 == PARSE_OK);
  }
  (parser->scanner).cursor = sVar7;
  return pVar2;
}

Assistant:

parse_status_t parser_parse_headers(http_parser_t *parser)
{
	parse_status_t status;
	memptr token;
	memptr hdr_value;
	token_type_t tok_type;
	scanner_t *scanner = &parser->scanner;
	size_t save_pos;
	http_header_t *header;
	int header_id;
	int ret = 0;
	int index;
	http_header_t *orig_header;
	char save_char;
	int ret2;
	static char zero = 0;

	assert(parser->position == (parser_pos_t)POS_HEADERS ||
		parser->ent_position == ENTREAD_CHUNKY_HEADERS);

	while (1) {
		save_pos = scanner->cursor;
		/* check end of headers */
		status = scanner_get_token(scanner, &token, &tok_type);
		if (status != (parse_status_t)PARSE_OK) {
			/* pushback tokens; useful only on INCOMPLETE error */
			scanner->cursor = save_pos;
			return status;
		}
		switch (tok_type) {
		case TT_CRLF:
			/* end of headers */
			if ((parser->msg.is_request) &&
				(parser->msg.method ==
					(http_method_t)HTTPMETHOD_POST)) {
				parser->position =
					POS_COMPLETE; /*post entity parsing */
				/*is handled separately  */
				return PARSE_SUCCESS;
			}
			parser->position = POS_ENTITY; /* read entity next */
			return PARSE_OK;
		case TT_IDENTIFIER:
			/* not end; read header */
			break;
		default:
			return PARSE_FAILURE; /* didn't see header name */
		}
		status = match(scanner, " : %R%c", &hdr_value);
		if (status != (parse_status_t)PARSE_OK) {
			/* pushback tokens; useful only on INCOMPLETE error */
			scanner->cursor = save_pos;
			return status;
		}
		/* add header */
		/* find header */
		index = map_str_to_int(token.buf,
			token.length,
			Http_Header_Names,
			NUM_HTTP_HEADER_NAMES,
			0);
		if (index != -1) {
			/*Check if it is a soap header */
			if (Http_Header_Names[index].id == HDR_SOAPACTION) {
				parser->msg.method = SOAPMETHOD_POST;
			}
			header_id = Http_Header_Names[index].id;
			orig_header =
				httpmsg_find_hdr(&parser->msg, header_id, NULL);
		} else {
			header_id = HDR_UNKNOWN;
			save_char = token.buf[token.length];
			token.buf[token.length] = '\0';
			orig_header =
				httpmsg_find_hdr_str(&parser->msg, token.buf);
			token.buf[token.length] = save_char; /* restore */
		}
		if (orig_header == NULL) {
			/* add new header */
			header = (http_header_t *)malloc(sizeof(http_header_t));
			if (header == NULL) {
				parser->http_error_code =
					HTTP_INTERNAL_SERVER_ERROR;
				return PARSE_FAILURE;
			}
			membuffer_init(&header->name_buf);
			membuffer_init(&header->value);
			/* value can be 0 length */
			if (hdr_value.length == (size_t)0) {
				hdr_value.buf = &zero;
				hdr_value.length = (size_t)1;
			}
			/* save in header in buffers */
			if (membuffer_assign(&header->name_buf,
				    token.buf,
				    token.length) ||
				membuffer_assign(&header->value,
					hdr_value.buf,
					hdr_value.length)) {
				/* not enough mem */
				membuffer_destroy(&header->value);
				membuffer_destroy(&header->name_buf);
				free(header);
				parser->http_error_code =
					HTTP_INTERNAL_SERVER_ERROR;
				return PARSE_FAILURE;
			}
			header->name.buf = header->name_buf.buf;
			header->name.length = header->name_buf.length;
			header->name_id = header_id;
			if (!ListAddTail(&parser->msg.headers, header)) {
				membuffer_destroy(&header->value);
				membuffer_destroy(&header->name_buf);
				free(header);
				parser->http_error_code =
					HTTP_INTERNAL_SERVER_ERROR;
				return PARSE_FAILURE;
			}
		} else if (hdr_value.length > (size_t)0) {
			/* append value to existing header */
			/* append space */
			ret = membuffer_append_str(&orig_header->value, ", ");
			/* append continuation of header value */
			ret2 = membuffer_append(&orig_header->value,
				hdr_value.buf,
				hdr_value.length);
			if (ret == UPNP_E_OUTOF_MEMORY ||
				ret2 == UPNP_E_OUTOF_MEMORY) {
				/* not enuf mem */
				parser->http_error_code =
					HTTP_INTERNAL_SERVER_ERROR;
				return PARSE_FAILURE;
			}
		}
	} /* end while */
}